

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::CheckStatusErrorsTest::ExpectError
          (CheckStatusErrorsTest *this,GLenum expected_error,GLchar *function,GLchar *conditions)

{
  int iVar1;
  GLenum GVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    iVar3 = (int)(ostringstream *)&local_1a8;
    if (function == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(function);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,function,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," was expected to generate ",0x1a);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", but ",6);
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," was observed instead when ",0x1b);
    if (conditions == (GLchar *)0x0) {
      std::ios::clear(iVar3 + (int)local_1a8[-3]);
    }
    else {
      sVar4 = strlen(conditions);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,conditions,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  do {
    iVar3 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar3 != 0);
  return GVar2 == expected_error;
}

Assistant:

bool CheckStatusErrorsTest::ExpectError(glw::GLenum expected_error, const glw::GLchar* function,
										const glw::GLchar* conditions)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function << " was expected to generate "
											<< glu::getErrorStr(expected_error) << ", but " << glu::getErrorStr(error)
											<< " was observed instead when " << conditions << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Clean additional possible errors. */
	while (gl.getError())
		;

	return is_ok;
}